

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

void __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::Supermap
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,
          unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
          *innerStorage,
          unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
          *diskDataStorage,
          function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
          *keyIndexStorageSupplier,
          function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
          *indexListSupplier,
          function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
          *registerSupplier,unsigned_long keyIndexBatchSize,double maxNotSortedPart)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  _func_int **pp_Var4;
  
  (this->super_KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>).
  _vptr_KeyValueStorage = (_func_int **)&PTR_add_00208988;
  (this->innerStorage_)._M_t.
  super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
  ._M_head_impl =
       (innerStorage->_M_t).
       super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
       .
       super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
       ._M_head_impl;
  (innerStorage->_M_t).
  super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
  ._M_head_impl =
       (ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long> *)0x0;
  (this->diskDataStorage_)._M_t.
  super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
  ._M_head_impl =
       (diskDataStorage->_M_t).
       super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
       .
       super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
       ._M_head_impl;
  (diskDataStorage->_M_t).
  super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
  ._M_head_impl =
       (KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
        *)0x0;
  if ((indexListSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*indexListSupplier->_M_invoker)((_Any_data *)&this->diskIndex_);
    *(undefined8 *)&(this->keyIndexStorageSupplier_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->keyIndexStorageSupplier_).super__Function_base._M_functor + 8) = 0
    ;
    (this->keyIndexStorageSupplier_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->keyIndexStorageSupplier_)._M_invoker = keyIndexStorageSupplier->_M_invoker;
    if ((keyIndexStorageSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
      uVar1 = *(undefined8 *)((long)&(keyIndexStorageSupplier->super__Function_base)._M_functor + 8)
      ;
      *(undefined8 *)&(this->keyIndexStorageSupplier_).super__Function_base._M_functor =
           *(undefined8 *)&(keyIndexStorageSupplier->super__Function_base)._M_functor;
      *(undefined8 *)((long)&(this->keyIndexStorageSupplier_).super__Function_base._M_functor + 8) =
           uVar1;
      (this->keyIndexStorageSupplier_).super__Function_base._M_manager =
           (keyIndexStorageSupplier->super__Function_base)._M_manager;
      (keyIndexStorageSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
      keyIndexStorageSupplier->_M_invoker = (_Invoker_type)0x0;
    }
    *(undefined8 *)&(this->indexListSupplier_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->indexListSupplier_).super__Function_base._M_functor + 8) = 0;
    (this->indexListSupplier_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->indexListSupplier_)._M_invoker = indexListSupplier->_M_invoker;
    if ((indexListSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
      uVar1 = *(undefined8 *)((long)&(indexListSupplier->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(this->indexListSupplier_).super__Function_base._M_functor =
           *(undefined8 *)&(indexListSupplier->super__Function_base)._M_functor;
      *(undefined8 *)((long)&(this->indexListSupplier_).super__Function_base._M_functor + 8) = uVar1
      ;
      (this->indexListSupplier_).super__Function_base._M_manager =
           (indexListSupplier->super__Function_base)._M_manager;
      (indexListSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
      indexListSupplier->_M_invoker = (_Invoker_type)0x0;
    }
    *(undefined8 *)&(this->registerSupplier_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->registerSupplier_).super__Function_base._M_functor + 8) = 0;
    (this->registerSupplier_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->registerSupplier_)._M_invoker = registerSupplier->_M_invoker;
    if ((registerSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
      uVar1 = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(this->registerSupplier_).super__Function_base._M_functor =
           *(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
      *(undefined8 *)((long)&(this->registerSupplier_).super__Function_base._M_functor + 8) = uVar1;
      (this->registerSupplier_).super__Function_base._M_manager =
           (registerSupplier->super__Function_base)._M_manager;
      (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
      registerSupplier->_M_invoker = (_Invoker_type)0x0;
    }
    this->keyIndexBatchSize_ = keyIndexBatchSize;
    (this->indexFilesPrefix)._M_dataplus._M_p = (pointer)&(this->indexFilesPrefix).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->indexFilesPrefix,"index-","");
    uVar2 = std::chrono::_V2::steady_clock::now();
    pp_Var4 = (_func_int **)(ulong)uVar2;
    (this->random)._M_x[0] = (unsigned_long)pp_Var4;
    lVar3 = 0x16;
    do {
      pp_Var4 = (_func_int **)
                (ulong)((((uint)((ulong)pp_Var4 >> 0x1e) ^ (uint)pp_Var4) * 0x6c078965 + (int)lVar3)
                       - 0x15);
      (&this->super_KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>)
      [lVar3]._vptr_KeyValueStorage = pp_Var4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x285);
    (this->random)._M_p = 0x270;
    this->maxNotSortedPart_ = maxNotSortedPart;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

explicit Supermap(std::unique_ptr<RamStorageBase> &&innerStorage,
                      std::unique_ptr<DiskStorage> &&diskDataStorage,
                      std::function<std::unique_ptr<IndexStorageBase>(IndexStorageBase &&)> keyIndexStorageSupplier,
                      std::function<std::unique_ptr<IndexStorageListBase>()> indexListSupplier,
                      std::function<std::unique_ptr<RegisterBase>()> registerSupplier,
                      IndexT keyIndexBatchSize,
                      double maxNotSortedPart)
        : innerStorage_(std::move(innerStorage)),
          diskDataStorage_(std::move(diskDataStorage)),
          diskIndex_(indexListSupplier()),
          keyIndexStorageSupplier_(std::move(keyIndexStorageSupplier)),
          indexListSupplier_(std::move(indexListSupplier)),
          registerSupplier_(std::move(registerSupplier)),
          keyIndexBatchSize_(keyIndexBatchSize),
          random(std::chrono::steady_clock::now().time_since_epoch().count()),
          maxNotSortedPart_(maxNotSortedPart) {}